

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sleeplock.cpp
# Opt level: O2

bool __thiscall ON_SleepLock::ReturnLock(ON_SleepLock *this)

{
  __atomic_flag_data_type _Var1;
  
  LOCK();
  _Var1 = (this->m_lockedX).super___atomic_flag_base._M_i;
  (this->m_lockedX).super___atomic_flag_base._M_i = true;
  UNLOCK();
  (this->m_lockedX).super___atomic_flag_base._M_i = false;
  return _Var1 != false;
}

Assistant:

bool ON_SleepLock::ReturnLock()
{
  // returns true if the input value of m_locked != 0.
  // returns false of the input value of m_locked = 0.
  // In all cases, the final value of m_locked = 0.

#if defined(ON_SLEEPLOCK_USES_STD_ATOMIC_FLAG)
  const bool b = m_lockedX.test_and_set(std::memory_order_acquire);
  m_lockedX.clear(std::memory_order_release);
  return b;
#else
  // Windows int locked = InterlockedExchange(((LONG*)(&(m_locked))),0);
  // does the following as an atomic operation:
  //    int locked = m_locked;
  //    m_locked = 0;
  //    // in all cases, the final value of m_locked = 0.
  int locked = InterlockedExchange(((LONG*)(&(m_locked))),0);
  return (0 != locked);
#endif
}